

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O2

string * __thiscall
test_cross_entropy_loss_back::vars_abi_cxx11_
          (string *__return_storage_ptr__,test_cross_entropy_loss_back *this)

{
  string sStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  var_to_str_abi_cxx11_(&local_38,this->type);
  std::operator+(&local_78,"type=",&local_38);
  std::operator+(&local_58,&local_78,",");
  var_to_str<long,4ul>(&sStack_b8,&this->ne);
  std::operator+(&local_98,"ne=",&sStack_b8);
  std::operator+(__return_storage_ptr__,&local_58,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&sStack_b8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string vars() override {
        return VARS_TO_STR2(type, ne);
    }